

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

optional<bool> RemoveRPathELF(string *file,string *emsg,bool *removed)

{
  vector<char,_std::allocator<char>_> *this;
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  StringEntry *pSVar5;
  long lVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  pointer ppVar9;
  long *plVar10;
  bool local_392;
  bool local_391;
  ulong local_390;
  unsigned_long j;
  fpos<__mbstate_t> local_380;
  int local_370;
  bool local_36a;
  bool local_369;
  int i_1;
  __mbstate_t local_360;
  bool local_351;
  undefined1 local_350 [8];
  ofstream f;
  const_iterator local_130;
  pair<long,_unsigned_long> *local_128;
  __normal_iterator<std::pair<long,_unsigned_long>_*,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>
  local_120;
  __normal_iterator<std::pair<long,_unsigned_long>_*,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>
  local_118;
  iterator it;
  unsigned_long entriesErased;
  unsigned_long sizeof_dentry;
  int i;
  DynamicEntryList dentries;
  StringEntry *se_runpath;
  StringEntry *se_rpath;
  StringEntry *se [2];
  int se_count;
  undefined1 local_a0 [8];
  cmELF elf;
  vector<char,_std::allocator<char>_> bytes;
  unsigned_long bytesBegin;
  unsigned_long zeroSize [2];
  unsigned_long zeroPosition [2];
  int local_2c;
  int zeroCount;
  bool *removed_local;
  string *emsg_local;
  string *file_local;
  
  if (removed != (bool *)0x0) {
    *removed = false;
  }
  local_2c = 0;
  zeroSize[1] = 0;
  zeroSize[0] = 0;
  bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 0;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)((long)&elf.ErrorMessage.field_2 + 8));
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmELF::cmELF((cmELF *)local_a0,pcVar4);
  bVar1 = cmELF::operator_cast_to_bool((cmELF *)local_a0);
  if (bVar1) {
    se[1]._0_4_ = 0;
    se_rpath = (StringEntry *)0x0;
    se[0] = (StringEntry *)0x0;
    pSVar5 = cmELF::GetRPath((cmELF *)local_a0);
    if (pSVar5 != (StringEntry *)0x0) {
      lVar6 = (long)(int)se[1];
      se[1]._0_4_ = (int)se[1] + 1;
      se[lVar6 + -1] = pSVar5;
    }
    pSVar5 = cmELF::GetRunPath((cmELF *)local_a0);
    if (pSVar5 != (StringEntry *)0x0) {
      lVar6 = (long)(int)se[1];
      se[1]._0_4_ = (int)se[1] + 1;
      se[lVar6 + -1] = pSVar5;
    }
    if ((int)se[1] == 0) {
      dentries.
      super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      std::optional<bool>::optional<bool,_true>
                ((optional<bool> *)((long)&file_local + 6),
                 (bool *)((long)&dentries.
                                 super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      se[1]._4_4_ = 1;
    }
    else {
      if (((int)se[1] == 2) && (se[0]->IndexInSection < se_rpath->IndexInSection)) {
        std::swap<cmELF::StringEntry_const*>(&se_rpath,se);
      }
      cmELF::GetDynamicEntries((DynamicEntryList *)&i,(cmELF *)local_a0);
      bVar1 = std::
              vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
              ::empty((vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                       *)&i);
      if (bVar1) {
        if (emsg != (string *)0x0) {
          std::__cxx11::string::operator=
                    ((string *)emsg,"DYNAMIC section contains a DT_NULL before the end.");
        }
        sizeof_dentry._7_1_ = 0;
        std::optional<bool>::optional<bool,_true>
                  ((optional<bool> *)((long)&file_local + 6),(bool *)((long)&sizeof_dentry + 7));
        se[1]._4_4_ = 1;
      }
      else {
        local_2c = (int)se[1];
        for (sizeof_dentry._0_4_ = 0; (int)sizeof_dentry < (int)se[1];
            sizeof_dentry._0_4_ = (int)sizeof_dentry + 1) {
          zeroSize[(long)(int)sizeof_dentry + 1] = se[(long)(int)sizeof_dentry + -1]->Position;
          zeroSize[(long)(int)sizeof_dentry + -1] = se[(long)(int)sizeof_dentry + -1]->Size;
        }
        uVar7 = cmELF::GetDynamicEntryPosition((cmELF *)local_a0,1);
        uVar8 = cmELF::GetDynamicEntryPosition((cmELF *)local_a0,0);
        it._M_current = (pair<long,_unsigned_long> *)0x0;
        local_118._M_current =
             (pair<long,_unsigned_long> *)
             std::
             vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
             ::begin((vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                      *)&i);
        while( true ) {
          local_120._M_current =
               (pair<long,_unsigned_long> *)
               std::
               vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
               ::end((vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                      *)&i);
          bVar1 = __gnu_cxx::operator!=(&local_118,&local_120);
          if (!bVar1) break;
          ppVar9 = __gnu_cxx::
                   __normal_iterator<std::pair<long,_unsigned_long>_*,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>
                   ::operator->(&local_118);
          if ((ppVar9->first == 0xf) ||
             (ppVar9 = __gnu_cxx::
                       __normal_iterator<std::pair<long,_unsigned_long>_*,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>
                       ::operator->(&local_118), ppVar9->first == 0x1d)) {
            __gnu_cxx::
            __normal_iterator<std::pair<long,unsigned_long>const*,std::vector<std::pair<long,unsigned_long>,std::allocator<std::pair<long,unsigned_long>>>>
            ::__normal_iterator<std::pair<long,unsigned_long>*>
                      ((__normal_iterator<std::pair<long,unsigned_long>const*,std::vector<std::pair<long,unsigned_long>,std::allocator<std::pair<long,unsigned_long>>>>
                        *)&local_130,&local_118);
            local_128 = (pair<long,_unsigned_long> *)
                        std::
                        vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                        ::erase((vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                 *)&i,local_130);
            it._M_current = (pair<long,_unsigned_long> *)((long)&(it._M_current)->first + 1);
            local_118._M_current = local_128;
          }
          else {
            ppVar9 = __gnu_cxx::
                     __normal_iterator<std::pair<long,_unsigned_long>_*,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>
                     ::operator->(&local_118);
            if ((ppVar9->first == 0x70000035) && (bVar1 = cmELF::IsMIPS((cmELF *)local_a0), bVar1))
            {
              lVar6 = (long)it._M_current * (uVar7 - uVar8);
              ppVar9 = __gnu_cxx::
                       __normal_iterator<std::pair<long,_unsigned_long>_*,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>
                       ::operator->(&local_118);
              ppVar9->second = lVar6 + ppVar9->second;
            }
            __gnu_cxx::
            __normal_iterator<std::pair<long,_unsigned_long>_*,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>
            ::operator++(&local_118,0);
          }
        }
        cmELF::EncodeDynamicEntries
                  ((vector<char,_std::allocator<char>_> *)&f.field_0x1f8,(cmELF *)local_a0,
                   (DynamicEntryList *)&i);
        std::vector<char,_std::allocator<char>_>::operator=
                  ((vector<char,_std::allocator<char>_> *)((long)&elf.ErrorMessage.field_2 + 8),
                   (vector<char,_std::allocator<char>_> *)&f.field_0x1f8);
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)&f.field_0x1f8);
        bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
             cmELF::GetDynamicEntryPosition((cmELF *)local_a0,0);
        se[1]._4_4_ = 0;
      }
      std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
      ::~vector((vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                 *)&i);
    }
  }
  else {
    std::optional<bool>::optional((optional<bool> *)((long)&file_local + 6));
    se[1]._4_4_ = 1;
  }
  cmELF::~cmELF((cmELF *)local_a0);
  if (se[1]._4_4_ == 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    _Var3 = std::operator|(_S_in,_S_out);
    _Var3 = std::operator|(_Var3,_S_bin);
    std::ofstream::ofstream(local_350,pcVar4,_Var3);
    bVar2 = std::ios::operator!((ios *)(local_350 + (long)*(_func_int **)((long)local_350 + -0x18)))
    ;
    if ((bVar2 & 1) == 0) {
      std::fpos<__mbstate_t>::fpos
                ((fpos<__mbstate_t> *)&i_1,
                 bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
      plVar10 = (long *)std::ostream::seekp(local_350,_i_1,local_360);
      bVar2 = std::ios::operator!((ios *)((long)plVar10 + *(long *)(*plVar10 + -0x18)));
      if ((bVar2 & 1) == 0) {
        this = (vector<char,_std::allocator<char>_> *)((long)&elf.ErrorMessage.field_2 + 8);
        pcVar4 = std::vector<char,_std::allocator<char>_>::data(this);
        std::vector<char,_std::allocator<char>_>::size(this);
        plVar10 = (long *)std::ostream::write(local_350,(long)pcVar4);
        bVar2 = std::ios::operator!((ios *)((long)plVar10 + *(long *)(*plVar10 + -0x18)));
        if ((bVar2 & 1) == 0) {
          for (local_370 = 0; local_370 < local_2c; local_370 = local_370 + 1) {
            std::fpos<__mbstate_t>::fpos(&local_380,zeroSize[(long)local_370 + 1]);
            plVar10 = (long *)std::ostream::seekp(local_350,local_380._M_off,local_380._M_state);
            bVar2 = std::ios::operator!((ios *)((long)plVar10 + *(long *)(*plVar10 + -0x18)));
            if ((bVar2 & 1) != 0) {
              if (emsg != (string *)0x0) {
                std::__cxx11::string::operator=((string *)emsg,"Error seeking to RPATH position.");
              }
              j._7_1_ = 0;
              std::optional<bool>::optional<bool,_true>
                        ((optional<bool> *)((long)&file_local + 6),(bool *)((long)&j + 7));
              goto LAB_002a3e27;
            }
            for (local_390 = 0; local_390 < zeroSize[(long)local_370 + -1];
                local_390 = local_390 + 1) {
              std::operator<<((ostream *)local_350,'\0');
            }
            bVar2 = std::ios::operator!((ios *)(local_350 +
                                               (long)*(_func_int **)((long)local_350 + -0x18)));
            if ((bVar2 & 1) != 0) {
              if (emsg != (string *)0x0) {
                std::__cxx11::string::operator=
                          ((string *)emsg,"Error writing the empty rpath string to the file.");
              }
              local_391 = false;
              std::optional<bool>::optional<bool,_true>
                        ((optional<bool> *)((long)&file_local + 6),&local_391);
              goto LAB_002a3e27;
            }
          }
          if (removed != (bool *)0x0) {
            *removed = true;
          }
          local_392 = true;
          std::optional<bool>::optional<bool,_true>
                    ((optional<bool> *)((long)&file_local + 6),&local_392);
        }
        else {
          if (emsg != (string *)0x0) {
            std::__cxx11::string::operator=((string *)emsg,"Error replacing DYNAMIC table header.");
          }
          local_36a = false;
          std::optional<bool>::optional<bool,_true>
                    ((optional<bool> *)((long)&file_local + 6),&local_36a);
        }
      }
      else {
        if (emsg != (string *)0x0) {
          std::__cxx11::string::operator=
                    ((string *)emsg,"Error seeking to DYNAMIC table header for RPATH.");
        }
        local_369 = false;
        std::optional<bool>::optional<bool,_true>
                  ((optional<bool> *)((long)&file_local + 6),&local_369);
      }
    }
    else {
      if (emsg != (string *)0x0) {
        std::__cxx11::string::operator=((string *)emsg,"Error opening file for update.");
      }
      local_351 = false;
      std::optional<bool>::optional<bool,_true>
                ((optional<bool> *)((long)&file_local + 6),&local_351);
    }
LAB_002a3e27:
    se[1]._4_4_ = 1;
    std::ofstream::~ofstream(local_350);
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)((long)&elf.ErrorMessage.field_2 + 8));
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)file_local._6_2_;
}

Assistant:

static cm::optional<bool> RemoveRPathELF(std::string const& file,
                                         std::string* emsg, bool* removed)
{
  if (removed) {
    *removed = false;
  }
  int zeroCount = 0;
  unsigned long zeroPosition[2] = { 0, 0 };
  unsigned long zeroSize[2] = { 0, 0 };
  unsigned long bytesBegin = 0;
  std::vector<char> bytes;
  {
    // Parse the ELF binary.
    cmELF elf(file.c_str());
    if (!elf) {
      return cm::nullopt; // Not a valid ELF file.
    }

    // Get the RPATH and RUNPATH entries from it and sort them by index
    // in the dynamic section header.
    int se_count = 0;
    cmELF::StringEntry const* se[2] = { nullptr, nullptr };
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      se[se_count++] = se_rpath;
    }
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      se[se_count++] = se_runpath;
    }
    if (se_count == 0) {
      // There is no RPATH or RUNPATH anyway.
      return true;
    }
    if (se_count == 2 && se[1]->IndexInSection < se[0]->IndexInSection) {
      std::swap(se[0], se[1]);
    }

    // Obtain a copy of the dynamic entries
    cmELF::DynamicEntryList dentries = elf.GetDynamicEntries();
    if (dentries.empty()) {
      // This should happen only for invalid ELF files where a DT_NULL
      // appears before the end of the table.
      if (emsg) {
        *emsg = "DYNAMIC section contains a DT_NULL before the end.";
      }
      return false;
    }

    // Save information about the string entries to be zeroed.
    zeroCount = se_count;
    for (int i = 0; i < se_count; ++i) {
      zeroPosition[i] = se[i]->Position;
      zeroSize[i] = se[i]->Size;
    }

    // Get size of one DYNAMIC entry
    unsigned long const sizeof_dentry =
      elf.GetDynamicEntryPosition(1) - elf.GetDynamicEntryPosition(0);

    // Adjust the entry list as necessary to remove the run path
    unsigned long entriesErased = 0;
    for (auto it = dentries.begin(); it != dentries.end();) {
      if (it->first == cmELF::TagRPath || it->first == cmELF::TagRunPath) {
        it = dentries.erase(it);
        entriesErased++;
        continue;
      }
      if (it->first == cmELF::TagMipsRldMapRel && elf.IsMIPS()) {
        // Background: debuggers need to know the "linker map" which contains
        // the addresses each dynamic object is loaded at. Most arches use
        // the DT_DEBUG tag which the dynamic linker writes to (directly) and
        // contain the location of the linker map, however on MIPS the
        // .dynamic section is always read-only so this is not possible. MIPS
        // objects instead contain a DT_MIPS_RLD_MAP tag which contains the
        // address where the dynamic linker will write to (an indirect
        // version of DT_DEBUG). Since this doesn't work when using PIE, a
        // relative equivalent was created - DT_MIPS_RLD_MAP_REL. Since this
        // version contains a relative offset, moving it changes the
        // calculated address. This may cause the dynamic linker to write
        // into memory it should not be changing.
        //
        // To fix this, we adjust the value of DT_MIPS_RLD_MAP_REL here. If
        // we move it up by n bytes, we add n bytes to the value of this tag.
        it->second += entriesErased * sizeof_dentry;
      }

      it++;
    }

    // Encode new entries list
    bytes = elf.EncodeDynamicEntries(dentries);
    bytesBegin = elf.GetDynamicEntryPosition(0);
  }

  // Open the file for update.
  cmsys::ofstream f(file.c_str(),
                    std::ios::in | std::ios::out | std::ios::binary);
  if (!f) {
    if (emsg) {
      *emsg = "Error opening file for update.";
    }
    return false;
  }

  // Write the new DYNAMIC table header.
  if (!f.seekp(bytesBegin)) {
    if (emsg) {
      *emsg = "Error seeking to DYNAMIC table header for RPATH.";
    }
    return false;
  }
  if (!f.write(bytes.data(), bytes.size())) {
    if (emsg) {
      *emsg = "Error replacing DYNAMIC table header.";
    }
    return false;
  }

  // Fill the RPATH and RUNPATH strings with zero bytes.
  for (int i = 0; i < zeroCount; ++i) {
    if (!f.seekp(zeroPosition[i])) {
      if (emsg) {
        *emsg = "Error seeking to RPATH position.";
      }
      return false;
    }
    for (unsigned long j = 0; j < zeroSize[i]; ++j) {
      f << '\0';
    }
    if (!f) {
      if (emsg) {
        *emsg = "Error writing the empty rpath string to the file.";
      }
      return false;
    }
  }

  // Everything was updated successfully.
  if (removed) {
    *removed = true;
  }
  return true;
}